

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_files.cpp
# Opt level: O0

void create_files(stringstream *ss)

{
  undefined8 uVar1;
  uint uVar2;
  time_t tVar3;
  ostream *poVar4;
  string local_90 [48];
  string local_60;
  int local_40;
  int local_3c;
  int i_1;
  int i;
  int seed [10];
  stringstream *ss_local;
  
  seed._32_8_ = ss;
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  for (local_3c = 0; local_3c < 10; local_3c = local_3c + 1) {
    uVar2 = rand();
    (&i_1)[local_3c] = uVar2 & 10000;
  }
  for (local_40 = 1; local_40 < 0xb; local_40 = local_40 + 1) {
    poVar4 = std::operator<<((ostream *)(seed._32_8_ + 0x10),"..\\Files\\");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_40);
    std::operator<<(poVar4,".txt");
    std::__cxx11::stringstream::str();
    populateFile(&local_60,(&i_1)[local_40]);
    std::__cxx11::string::~string((string *)&local_60);
    uVar1 = seed._32_8_;
    std::__cxx11::string::string(local_90);
    std::__cxx11::stringstream::str((string *)uVar1);
    std::__cxx11::string::~string(local_90);
  }
  return;
}

Assistant:

void create_files(std::stringstream &ss) {
    srand(time(NULL));
    int seed[N];
    for (int i = 0; i < 10; ++i) {
        seed[i] = rand() & 10000;
    }
    for (int i = 1; i <= 10; i++) {
        ss << "..\\Files\\" << i << ".txt";
        populateFile(ss.str(), seed[i]);
        ss.str(std::string());
    }
}